

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver-test.cc
# Opt level: O0

void __thiscall
SolverTest_OptionNotPrintedWhenEchoOff_Test::~SolverTest_OptionNotPrintedWhenEchoOff_Test
          (SolverTest_OptionNotPrintedWhenEchoOff_Test *this)

{
  void *in_RDI;
  
  ~SolverTest_OptionNotPrintedWhenEchoOff_Test
            ((SolverTest_OptionNotPrintedWhenEchoOff_Test *)0x164938);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(SolverTest, OptionNotPrintedWhenEchoOff) {
  TestSolver s;
  FormatOption *opt = 0;
  s.AddOption(SolverOptionPtr(opt = new FormatOption()));
  EXPECT_EQ(0, opt->format_count);
  s.ParseOptions(Args("fmtopt=?"));
  EXPECT_EQ(0, opt->format_count);
}